

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtr_mgr.c
# Opt level: O0

int rtr_mgr_config_cmp(void *a,void *b)

{
  long in_FS_OFFSET;
  rtr_mgr_group *br;
  rtr_mgr_group *ar;
  void *b_local;
  void *a_local;
  
  if (*(byte *)((long)b + 0xc) < *(byte *)((long)a + 0xc)) {
    a_local._4_4_ = 1;
  }
  else if (*(byte *)((long)a + 0xc) < *(byte *)((long)b + 0xc)) {
    a_local._4_4_ = -1;
  }
  else {
    a_local._4_4_ = 0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    return a_local._4_4_;
  }
  __stack_chk_fail();
}

Assistant:

int rtr_mgr_config_cmp(const void *a, const void *b)
{
	const struct rtr_mgr_group *ar = a;
	const struct rtr_mgr_group *br = b;

	if (ar->preference > br->preference)
		return 1;
	else if (ar->preference < br->preference)
		return -1;
	return 0;
}